

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::vmessage(Internal *this,char *fmt,va_list *ap)

{
  __gnuc_va_list in_RDX;
  char *in_RSI;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0xe1c) == 0) {
    print_prefix((Internal *)0xdd1902);
    vprintf(in_RSI,in_RDX);
    fputc(10,_stdout);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Internal::vmessage (const char *fmt, va_list &ap) {
#ifdef LOGGING
  if (!opts.log)
#endif
    if (opts.quiet)
      return;
  print_prefix ();
  vprintf (fmt, ap);
  fputc ('\n', stdout);
  fflush (stdout);
}